

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O1

string_view __thiscall uWS::HttpRequest::getHeader(HttpRequest *this,string_view lowerCasedHeader)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar5;
  Header *pHVar6;
  string_view sVar7;
  size_t sVar3;
  
  bVar1 = BloomFilter::mightHave(&this->bf,lowerCasedHeader);
  sVar3 = CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    sVar4 = this->headers[1].key._M_len;
    bVar1 = sVar4 == 0;
    pcVar5 = extraout_RDX;
    if (!bVar1) {
      pHVar6 = this->headers + 2;
      do {
        if (sVar4 == lowerCasedHeader._M_len) {
          iVar2 = strncmp(pHVar6[-1].key._M_str,lowerCasedHeader._M_str,lowerCasedHeader._M_len);
          sVar3 = CONCAT44(extraout_var_00,iVar2);
          pcVar5 = extraout_RDX_00;
          if (iVar2 == 0) {
            sVar3 = pHVar6[-1].value._M_len;
            pcVar5 = pHVar6[-1].value._M_str;
            break;
          }
        }
        sVar4 = (pHVar6->key)._M_len;
        pHVar6 = pHVar6 + 1;
        bVar1 = sVar4 == 0;
      } while (!bVar1);
    }
    if (!bVar1) goto LAB_0013fe67;
  }
  sVar3 = 0;
  pcVar5 = (char *)0x0;
LAB_0013fe67:
  sVar7._M_str = pcVar5;
  sVar7._M_len = sVar3;
  return sVar7;
}

Assistant:

std::string_view getHeader(std::string_view lowerCasedHeader) {
        if (bf.mightHave(lowerCasedHeader)) {
            for (Header *h = headers; (++h)->key.length(); ) {
                if (h->key.length() == lowerCasedHeader.length() && !strncmp(h->key.data(), lowerCasedHeader.data(), lowerCasedHeader.length())) {
                    return h->value;
                }
            }
        }
        return std::string_view(nullptr, 0);
    }